

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

bool IsKeyword(string *keyword)

{
  ulong uVar1;
  __type _Var2;
  ulong uVar3;
  string *__rhs;
  
  __rhs = KeyWord_abi_cxx11_;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 10) break;
    _Var2 = std::operator==(keyword,__rhs);
    __rhs = __rhs + 1;
    uVar1 = uVar3 + 1;
  } while (!_Var2);
  return uVar3 < 10;
}

Assistant:

bool IsKeyword(string keyword) {
    //int length = KeyWord->size();  //Wrong!
    int length = sizeof(KeyWord) / sizeof(KeyWord[0]);
    for (int i = 0; i < length; i++) {
        if (keyword == KeyWord[i])
            return true;
    }
    return false;
}